

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O3

float32 roundAndPackFloat32(flag zSign,int zExp,uint32_t zSig,float_status *status)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  bool bVar5;
  
  cVar1 = status->float_rounding_mode;
  switch(cVar1) {
  case '\0':
  case '\x04':
    bVar4 = 0x40;
    break;
  case '\x01':
    bVar4 = 0x7f;
    if (zSign == '\0') {
      bVar4 = 0;
    }
    break;
  case '\x02':
    bVar4 = 0x7f;
    if (zSign != '\0') {
      bVar4 = 0;
    }
    break;
  case '\x03':
    bVar4 = 0;
    break;
  case '\x05':
    bVar4 = 0x7f;
    if ((char)zSig < '\0') {
      bVar4 = 0;
    }
    break;
  default:
    abort();
  }
  if (0xfc < (zExp & 0xffffU)) {
    if (0xfd < zExp) {
LAB_00cf78ab:
      status->float_exception_flags = status->float_exception_flags | 0x28;
      return ((uint)zSign * -0x80000000 - (uint)(bVar4 == 0 || cVar1 == '\x05')) + 0x7f800000;
    }
    if (zExp == 0xfd) {
      zExp = 0xfd;
      if ((int)(bVar4 + zSig) < 0) goto LAB_00cf78ab;
    }
    else if (zExp < 0) {
      if (status->flush_to_zero != '\0') {
        status->float_exception_flags = status->float_exception_flags | 0x80;
        return (uint)zSign << 0x1f;
      }
      bVar5 = true;
      if ((zExp == -1) && (status->float_detect_tininess != '\x01')) {
        bVar5 = -1 < (int)(bVar4 + zSig);
      }
      if ((uint)-zExp < 0x20) {
        zSig = (uint)(zSig << ((byte)zExp & 0x1f) != 0) | zSig >> ((byte)-zExp & 0x1f);
      }
      else {
        zSig = (uint32_t)(zSig != 0);
      }
      if ((bool)(bVar5 & (zSig & 0x7f) != 0)) {
        status->float_exception_flags = status->float_exception_flags | 0x10;
      }
      zExp = 0;
      if (cVar1 == '\x05') {
        zExp = 0;
        bVar4 = 0x7f;
        if ((char)zSig < '\0') {
          bVar4 = 0;
        }
      }
    }
  }
  if ((zSig & 0x7f) != 0) {
    status->float_exception_flags = status->float_exception_flags | 0x20;
  }
  uVar2 = ~(uint)((zSig & 0x7f) == 0x40 && cVar1 == '\0') & zSig + bVar4 >> 7;
  iVar3 = zExp << 0x17;
  if (uVar2 == 0) {
    iVar3 = 0;
  }
  return ((uint)zSign << 0x1f | uVar2) + iVar3;
}

Assistant:

static float32 roundAndPackFloat32(flag zSign, int zExp, uint32_t zSig,
                                   float_status *status)
{
    int8_t roundingMode;
    flag roundNearestEven;
    int8_t roundIncrement, roundBits;
    flag isTiny;

    roundingMode = status->float_rounding_mode;
    roundNearestEven = ( roundingMode == float_round_nearest_even );
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        roundIncrement = 0x40;
        break;
    case float_round_to_zero:
        roundIncrement = 0;
        break;
    case float_round_up:
        roundIncrement = zSign ? 0 : 0x7f;
        break;
    case float_round_down:
        roundIncrement = zSign ? 0x7f : 0;
        break;
    case float_round_to_odd:
        roundIncrement = zSig & 0x80 ? 0 : 0x7f;
        break;
    default:
        abort();
        break;
    }
    roundBits = zSig & 0x7F;
    if ( 0xFD <= (uint16_t) zExp ) {
        if (    ( 0xFD < zExp )
             || (    ( zExp == 0xFD )
                  && ( (int32_t) ( zSig + roundIncrement ) < 0 ) )
           ) {
            bool overflow_to_inf = roundingMode != float_round_to_odd &&
                                   roundIncrement != 0;
            float_raise(float_flag_overflow | float_flag_inexact, status);
            return packFloat32(zSign, 0xFF, -!overflow_to_inf);
        }
        if ( zExp < 0 ) {
            if (status->flush_to_zero) {
                float_raise(float_flag_output_denormal, status);
                return packFloat32(zSign, 0, 0);
            }
            isTiny =
                (status->float_detect_tininess
                 == float_tininess_before_rounding)
                || ( zExp < -1 )
                || ( zSig + roundIncrement < 0x80000000 );
            shift32RightJamming( zSig, - zExp, &zSig );
            zExp = 0;
            roundBits = zSig & 0x7F;
            if (isTiny && roundBits) {
                float_raise(float_flag_underflow, status);
            }
            if (roundingMode == float_round_to_odd) {
                /*
                 * For round-to-odd case, the roundIncrement depends on
                 * zSig which just changed.
                 */
                roundIncrement = zSig & 0x80 ? 0 : 0x7f;
            }
        }
    }
    if (roundBits) {
        status->float_exception_flags |= float_flag_inexact;
    }
    zSig = ( zSig + roundIncrement )>>7;
    zSig &= ~ ( ( ( roundBits ^ 0x40 ) == 0 ) & roundNearestEven );
    if ( zSig == 0 ) zExp = 0;
    return packFloat32( zSign, zExp, zSig );

}